

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O3

double3 * tinyusdz::transform(double3 *__return_storage_ptr__,matrix4d *m,double3 *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  size_t j;
  long lVar4;
  long lVar5;
  Ty value;
  double dVar6;
  array<double,_3UL> ret;
  
  dVar2 = m->m[3][0];
  dVar3 = m->m[3][1];
  dVar1 = m->m[3][2];
  lVar4 = 0;
  do {
    dVar6 = 0.0;
    lVar5 = 0;
    do {
      dVar6 = dVar6 + *(double *)((long)m + lVar5 * 4) * *(double *)((long)p->_M_elems + lVar5);
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x18);
    ret._M_elems[lVar4] = dVar6;
    lVar4 = lVar4 + 1;
    m = (matrix4d *)((long)m + 8);
  } while (lVar4 != 3);
  __return_storage_ptr__->_M_elems[0] = dVar2 + ret._M_elems[0];
  __return_storage_ptr__->_M_elems[1] = dVar3 + ret._M_elems[1];
  __return_storage_ptr__->_M_elems[2] = dVar1 + ret._M_elems[2];
  return __return_storage_ptr__;
}

Assistant:

value::double3 transform(const value::matrix4d &m, const value::double3 &p) {
  value::double3 tx{m.m[3][0], m.m[3][1], m.m[3][2]};
  return value::MultV<value::matrix4d, value::double3, double, double, 3>(m, p) + tx;
}